

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_lite.h
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldLite<int,_int>::~MapFieldLite(MapFieldLite<int,_int> *this)

{
  Arena **v1;
  void **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  Arena *arena;
  undefined1 local_60 [8];
  Map<int,_int> swapped_map;
  Voidify local_29;
  void *local_28;
  Arena *local_20;
  Nullable<const_char_*> local_18;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  MapFieldLite<int,_int> *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)this;
  local_20 = UntypedMapBase::arena((UntypedMapBase *)this);
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Arena*>(&local_20);
  local_28 = (void *)0x0;
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_28);
  local_18 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::Arena*,decltype(nullptr)>
                       (v1,v2,"map_.arena() == nullptr");
  if (local_18 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_18);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)
               &swapped_map.super_KeyMapBase<unsigned_int>.super_UntypedMapBase.arena_,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field_lite.h"
               ,0x37,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)
                        &swapped_map.super_KeyMapBase<unsigned_int>.super_UntypedMapBase.arena_);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)
               &swapped_map.super_KeyMapBase<unsigned_int>.super_UntypedMapBase.arena_);
  }
  arena = UntypedMapBase::arena((UntypedMapBase *)this);
  Map<int,_int>::Map((Map<int,_int> *)local_60,arena);
  Map<int,_int>::InternalSwap((Map<int,_int> *)this,(Map<int,_int> *)local_60);
  Map<int,_int>::~Map((Map<int,_int> *)local_60);
  return;
}

Assistant:

~MapFieldLite() {
    ABSL_DCHECK_EQ(map_.arena(), nullptr);
    // We want to destruct the map in such a way that we can verify
    // that we've done that, but also be sure that we've deallocated
    // everything (as opposed to leaving an allocation behind with no
    // data in it, as would happen if a vector was resize'd to zero.
    // Map::Swap with an empty map accomplishes that.
    decltype(map_) swapped_map(map_.arena());
    map_.InternalSwap(&swapped_map);
  }